

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_30::AsyncStreamFd::getsockopt
          (AsyncStreamFd *this,int __fd,int __level,int __optname,void *__optval,socklen_t *__optlen
          )

{
  int iVar1;
  undefined4 in_register_0000000c;
  socklen_t socklen;
  Fault f;
  socklen_t local_3c;
  Fault local_38;
  
  local_3c = *__optval;
  do {
    iVar1 = ::getsockopt((this->super_OwnedFileDescriptor).fd,__fd,__level,
                         (void *)CONCAT44(in_register_0000000c,__optname),&local_3c);
    if (-1 < iVar1) goto LAB_002f4677;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0xcf,iVar1,"::getsockopt(fd, level, option, value, &socklen)","");
    _::Debug::Fault::fatal(&local_38);
  }
LAB_002f4677:
  *(socklen_t *)__optval = local_3c;
  return local_3c;
}

Assistant:

void getsockopt(int level, int option, void* value, uint* length) override {
    socklen_t socklen = *length;
    KJ_SYSCALL(::getsockopt(fd, level, option, value, &socklen));
    *length = socklen;
  }